

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

void __thiscall chrono::fea::ChElementShellANCF_3833::ComputeNormal(ChElementShellANCF_3833 *this)

{
  long in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  ComputeNormal((ChVector<double> *)this,(ChElementShellANCF_3833 *)(in_RSI + -0x48),in_XMM0_Qa,
                in_XMM1_Qa);
  return;
}

Assistant:

ChVector<> ChElementShellANCF_3833::ComputeNormal(const double xi, const double eta) {
    VectorN Sxi_zeta_compact;
    Calc_Sxi_zeta_compact(Sxi_zeta_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // Calculate the position vector gradient with respect to zeta at the current point (whose length may not equal 1)
    ChVector<> r_zeta = e_bar * Sxi_zeta_compact;

    return r_zeta.GetNormalized();
}